

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfWrite.c
# Opt level: O1

int Cnf_IsopCountLiterals(Vec_Int_t *vIsop,int nVars)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  
  if (0 < (long)vIsop->nSize) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      if (0 < nVars) {
        uVar3 = vIsop->pArray[lVar2];
        iVar4 = nVars;
        do {
          iVar1 = iVar1 + (uint)((uVar3 & 3) - 1 < 2);
          uVar3 = (int)uVar3 >> 2;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != vIsop->nSize);
    return iVar1;
  }
  return 0;
}

Assistant:

int Cnf_IsopCountLiterals( Vec_Int_t * vIsop, int nVars )
{
    int nLits = 0, Cube, i, b;
    Vec_IntForEachEntry( vIsop, Cube, i )
    {
        for ( b = 0; b < nVars; b++ )
        {
            if ( (Cube & 3) == 1 || (Cube & 3) == 2 )
                nLits++;
            Cube >>= 2;
        }
    }
    return nLits;
}